

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_build_unencoding_stack(connectdata *conn,char *enclist,int maybechunked)

{
  Curl_easy *pCVar1;
  byte *first;
  int iVar2;
  contenc_writer *pcVar3;
  bool bVar4;
  contenc_writer *writer;
  content_encoding *encoding;
  size_t namelen;
  char *name;
  SingleRequest *k;
  Curl_easy *data;
  byte *pbStack_20;
  int maybechunked_local;
  char *enclist_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  pbStack_20 = (byte *)enclist;
  do {
    while( true ) {
      first = pbStack_20;
      iVar2 = Curl_isspace((uint)*pbStack_20);
      bVar4 = true;
      if (iVar2 == 0) {
        bVar4 = *pbStack_20 == 0x2c;
      }
      if (!bVar4) break;
      pbStack_20 = pbStack_20 + 1;
    }
    encoding = (content_encoding *)0x0;
    while( true ) {
      bVar4 = false;
      if (*pbStack_20 != 0) {
        bVar4 = *pbStack_20 != 0x2c;
      }
      if (!bVar4) break;
      iVar2 = Curl_isspace((uint)*pbStack_20);
      if (iVar2 == 0) {
        encoding = (content_encoding *)(pbStack_20 + (1 - (long)first));
      }
      pbStack_20 = pbStack_20 + 1;
    }
    if (((maybechunked == 0) || (encoding != (content_encoding *)0x7)) ||
       (iVar2 = Curl_strncasecompare((char *)first,"chunked",7), iVar2 == 0)) {
      if (encoding != (content_encoding *)0x0) {
        writer = (contenc_writer *)find_encoding((char *)first,(size_t)encoding);
        if ((pCVar1->req).writer_stack == (contenc_writer_s *)0x0) {
          pcVar3 = new_unencoding_writer(conn,&client_encoding,(contenc_writer *)0x0);
          (pCVar1->req).writer_stack = pcVar3;
          if ((pCVar1->req).writer_stack == (contenc_writer_s *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if ((content_encoding *)writer == (content_encoding *)0x0) {
          writer = (contenc_writer *)&error_encoding;
        }
        pcVar3 = new_unencoding_writer(conn,(content_encoding *)writer,(pCVar1->req).writer_stack);
        if (pcVar3 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pCVar1->req).writer_stack = pcVar3;
      }
    }
    else {
      (pCVar1->req).chunk = true;
      Curl_httpchunk_init(conn);
    }
    if (*pbStack_20 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct connectdata *conn,
                                     const char *enclist, int maybechunked)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(conn);   /* init our chunky engine. */
    }
    else if(namelen) {
      const content_encoding *encoding = find_encoding(name, namelen);
      contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(conn, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(conn, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}